

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O3

int sameSrcAlias(SrcItem *p0,SrcList *pSrc)

{
  SrcItem *pSVar1;
  byte bVar2;
  int iVar3;
  Select *pSVar4;
  char *pcVar5;
  int iVar6;
  long lVar7;
  long lVar8;
  
  iVar3 = pSrc->nSrc;
  if (0 < (long)iVar3) {
    lVar8 = 0;
    do {
      pSVar1 = pSrc->a + lVar8;
      if (pSVar1 != p0) {
        if (p0->pSTab == pSVar1->pSTab) {
          pcVar5 = pSVar1->zAlias;
          if (p0->zAlias == (char *)0x0) {
            if (pcVar5 == (char *)0x0) {
              return 1;
            }
          }
          else if (pcVar5 != (char *)0x0) {
            lVar7 = 0;
            do {
              bVar2 = p0->zAlias[lVar7];
              if (bVar2 == pcVar5[lVar7]) {
                if ((ulong)bVar2 == 0) {
                  return 1;
                }
              }
              else if (""[bVar2] != ""[(byte)pcVar5[lVar7]]) break;
              lVar7 = lVar7 + 1;
            } while( true );
          }
        }
        if (((((pSVar1->fg).field_0x1 & 4) != 0) &&
            (pSVar4 = ((pSVar1->u4).pSubq)->pSelect, (pSVar4->selFlags & 0x800) != 0)) &&
           (iVar6 = sameSrcAlias(p0,pSVar4->pSrc), iVar6 != 0)) {
          return 1;
        }
      }
      lVar8 = lVar8 + 1;
    } while (lVar8 != iVar3);
  }
  return 0;
}

Assistant:

static int sameSrcAlias(SrcItem *p0, SrcList *pSrc){
  int i;
  for(i=0; i<pSrc->nSrc; i++){
    SrcItem *p1 = &pSrc->a[i];
    if( p1==p0 ) continue;
    if( p0->pSTab==p1->pSTab && 0==sqlite3_stricmp(p0->zAlias, p1->zAlias) ){
      return 1;
    }
    if( p1->fg.isSubquery
     && (p1->u4.pSubq->pSelect->selFlags & SF_NestedFrom)!=0
     && sameSrcAlias(p0, p1->u4.pSubq->pSelect->pSrc)
    ){
      return 1;
    }
  }
  return 0;
}